

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O2

CEAngle __thiscall
CECoordinates::AngularSeparation(CECoordinates *this,CECoordinates *coords1,CECoordinates *coords2)

{
  CECoordinateType CVar1;
  CECoordinateType CVar2;
  invalid_value *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  CEAngle CVar3;
  double y2;
  double y1;
  CEAngle CStack_c8;
  CEAngle local_b8;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  CEAngle local_88;
  string local_78;
  undefined1 local_58 [48];
  double local_28;
  
  CVar1 = GetCoordSystem(coords1);
  CVar2 = GetCoordSystem(coords2);
  if (CVar1 == CVar2) {
    CppEphem::julian_date_J2000();
    (*coords1->_vptr_CECoordinates[7])(coords1);
    local_a0 = extraout_XMM0_Qa;
    local_90 = extraout_XMM0_Qa;
    CppEphem::julian_date_J2000();
    (*coords2->_vptr_CECoordinates[7])(coords2);
    local_a8 = extraout_XMM0_Qa_00;
    local_98 = extraout_XMM0_Qa_00;
    CVar1 = GetCoordSystem(coords1);
    if (CVar1 == OBSERVED) {
      local_a0 = 1.5707963267948966 - local_90;
      local_a8 = 1.5707963267948966 - local_98;
    }
    local_58._40_8_ = CppEphem::julian_date_J2000();
    (*coords1->_vptr_CECoordinates[3])(&local_78,coords1);
    CEAngle::CEAngle(&local_b8,&local_a0);
    local_58._32_8_ = CppEphem::julian_date_J2000();
    (*coords2->_vptr_CECoordinates[3])(&CStack_c8,coords2);
    CEAngle::CEAngle(&local_88,&local_a8);
    AngularSeparation((CECoordinates *)local_58,(CEAngle *)&local_78,&local_b8,&CStack_c8,&local_88)
    ;
    local_28 = CEAngle::operator_cast_to_double((CEAngle *)local_58);
    CEAngle::CEAngle((CEAngle *)this,&local_28);
    CEAngle::~CEAngle((CEAngle *)local_58);
    CEAngle::~CEAngle(&local_88);
    CEAngle::~CEAngle(&CStack_c8);
    CEAngle::~CEAngle(&local_b8);
    CEAngle::~CEAngle((CEAngle *)&local_78);
    CVar3.angle_ = extraout_XMM0_Qa_01;
    CVar3._vptr_CEAngle = (_func_int **)this;
    return CVar3;
  }
  this_00 = (invalid_value *)__cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_58,"CECoordinates::AngularSeparation(CECoords&, CECoords&)",
             (allocator *)&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"Supplied coordinates are in different frames",
             (allocator *)&CStack_c8);
  CEException::invalid_value::invalid_value(this_00,(string *)local_58,&local_78);
  __cxa_throw(this_00,&CEException::invalid_value::typeinfo,CEExceptionHandler::~CEExceptionHandler)
  ;
}

Assistant:

CEAngle CECoordinates::AngularSeparation(const CECoordinates& coords1, 
                                         const CECoordinates& coords2)
{
    // Make sure the coordinates are in the same frame
    if (coords1.GetCoordSystem() != coords2.GetCoordSystem()) {
        throw CEException::invalid_value("CECoordinates::AngularSeparation(CECoords&, CECoords&)",
                                         "Supplied coordinates are in different frames");
    }

    // Get the appropriate Y-Coordinates
    double y1 = coords1.YCoordinate_Rad();
    double y2 = coords2.YCoordinate_Rad();
    if (coords1.GetCoordSystem() == CECoordinateType::OBSERVED) {
        y1 = M_PI_2 - y1;
        y2 = M_PI_2 - y2;
    }

    // Convert the second coordinates to be the same type as the first set of coordinates
    CEAngle angsep = AngularSeparation(coords1.XCoord(), y1,
                                       coords2.XCoord(), y2) ;
    
    return angsep ;
}